

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput_unix.cpp
# Opt level: O0

int Lodtalk::OSIO::stWriteOffsetSizeTo(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  void *pvVar3;
  SmallIntegerValue SVar4;
  size_t __n;
  SmallIntegerValue SVar5;
  ssize_t sVar6;
  ssize_t res;
  SmallIntegerValue file;
  SmallIntegerValue size;
  SmallIntegerValue offset;
  uint8_t *buffer;
  Oop fileOop;
  Oop sizeOop;
  Oop offsetOop;
  Oop bufferOop;
  InterpreterProxy *interpreter_local;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 4) {
    offsetOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    offsetOop.field_0.uintValue._4_4_ = extraout_var_00;
    sizeOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
    sizeOop.field_0.uintValue._4_4_ = extraout_var_01;
    fileOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,2);
    fileOop.field_0.uintValue._4_4_ = extraout_var_02;
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,3);
    buffer = (uint8_t *)CONCAT44(extraout_var_03,iVar2);
    bVar1 = Oop::isIndexableNativeData(&offsetOop);
    if ((((bVar1) && (bVar1 = Oop::isSmallInteger(&sizeOop), bVar1)) &&
        (bVar1 = Oop::isSmallInteger(&fileOop), bVar1)) &&
       (bVar1 = Oop::isSmallInteger((Oop *)&buffer), bVar1)) {
      pvVar3 = Oop::getFirstFieldPointer(&offsetOop);
      SVar4 = Oop::decodeSmallInteger(&sizeOop);
      __n = Oop::decodeSmallInteger(&fileOop);
      SVar5 = Oop::decodeSmallInteger((Oop *)&buffer);
      if (SVar4 < 0) {
        interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
      }
      else {
        sVar6 = write((int)SVar5,(void *)((long)pvVar3 + SVar4),__n);
        interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x15])(interpreter,sVar6);
      }
    }
    else {
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
    }
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int OSIO::stWriteOffsetSizeTo(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 4)
        return interpreter->primitiveFailed();

    Oop bufferOop = interpreter->getTemporary(0);
    Oop offsetOop = interpreter->getTemporary(1);
    Oop sizeOop = interpreter->getTemporary(2);
    Oop fileOop = interpreter->getTemporary(3);

	// Check the arguments.
	if(!bufferOop.isIndexableNativeData() || !offsetOop.isSmallInteger() || !sizeOop.isSmallInteger() || !fileOop.isSmallInteger())
		return interpreter->primitiveFailed();

	// Decode the arguments
	auto buffer = reinterpret_cast<uint8_t *> (bufferOop.getFirstFieldPointer());
	auto offset = offsetOop.decodeSmallInteger();
	auto size = sizeOop.decodeSmallInteger();
	auto file = fileOop.decodeSmallInteger();

	// Validate some of the arguments.
	if(offset < 0)
		return interpreter->primitiveFailed();

	// Perform the write
	auto res = write(file, buffer + offset, size);
	return interpreter->returnSmallInteger(res);
}